

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O1

ON_SimpleArray<int> * __thiscall
ON_ClippingPlane::LayerClipParticipationList(ON_ClippingPlane *this)

{
  ON_ClippingPlaneData *pOVar1;
  ON_SimpleArray<int> *pOVar2;
  
  pOVar1 = GetClippingPlaneData((this->m_data_store).m_sn);
  if (pOVar1 == (ON_ClippingPlaneData *)0x0) {
    pOVar2 = (ON_SimpleArray<int> *)0x0;
  }
  else {
    if (pOVar1->m_layer_list_is_sorted == false) {
      ON_SimpleArray<int>::QuickSort(&pOVar1->m_layer_list,ON_CompareIncreasing<int>);
      pOVar1->m_layer_list_is_sorted = true;
    }
    pOVar2 = &pOVar1->m_layer_list;
  }
  return pOVar2;
}

Assistant:

const ON_SimpleArray<int>* ON_ClippingPlane::LayerClipParticipationList() const
{
  ON_ClippingPlaneData* data = GetClippingPlaneData(m_data_store.m_sn);
  if (data)
  {
    if (!data->m_layer_list_is_sorted)
    {
      data->m_layer_list.QuickSort(ON_CompareIncreasing<int>);
      data->m_layer_list_is_sorted = true;
    }
    return &(data->m_layer_list);
  }
  return nullptr;
}